

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isSortingIndex(WhereBestIdx *p,Index *pIdx,int base,int *pbRev,int *pbObUnique)

{
  int iVar1;
  Table *pTVar2;
  Parse *pParse_00;
  sqlite3 *psVar3;
  ExprList *pEVar4;
  WhereMaskSet *pMaskSet;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Expr *pEVar8;
  WhereTerm *pWVar9;
  Bitmask BVar10;
  Bitmask BVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  Bitmask m;
  WhereMaskSet *pMS;
  Expr *pRight;
  WhereTerm *pConstraint;
  char *zColl;
  int local_a8;
  int isMatch;
  int isEq;
  int iSortOrder;
  int iColumn;
  int termSortOrder;
  CollSeq *pColl;
  Expr *pOBExpr;
  u32 wsFlags;
  int outerObUnique;
  int uniqueNotNull;
  int seenRowid;
  int nPriorSat;
  sqlite3 *db;
  Parse *pParse;
  ExprList *pOrderBy;
  Table *pTab;
  ExprList_item *pOBItem;
  int nTerm;
  int sortOrder;
  int j;
  int i;
  int *pbObUnique_local;
  int *pbRev_local;
  int base_local;
  Index *pIdx_local;
  WhereBestIdx *p_local;
  
  pOBItem._4_4_ = 2;
  pTVar2 = pIdx->pTable;
  pParse_00 = p->pParse;
  psVar3 = pParse_00->db;
  bVar14 = false;
  if (p->i == 0) {
    uniqueNotNull = 0;
    bVar12 = true;
  }
  else {
    uVar7 = p->aLevel[p->i + -1].plan.wsFlags;
    uniqueNotNull = (int)p->aLevel[p->i + -1].plan.nOBSat;
    if ((uVar7 & 0x800000) == 0) {
      return uniqueNotNull;
    }
    if ((psVar3->dbOptFlags & 0x80) != 0) {
      return uniqueNotNull;
    }
    bVar12 = (uVar7 & 0x4004000) != 0;
  }
  pEVar4 = p->pOrderBy;
  if (((byte)pIdx->field_0x4f >> 2 & 1) != 0) {
    return uniqueNotNull;
  }
  iVar1 = pEVar4->nExpr;
  wsFlags = (u32)(pIdx->onError != '\0');
  nTerm = uniqueNotNull;
  sortOrder = 0;
  pTab = (Table *)(pEVar4->a + uniqueNotNull);
  do {
    bVar13 = false;
    if (nTerm < iVar1) {
      bVar13 = sortOrder <= (int)(uint)pIdx->nColumn;
    }
    if (((!bVar13) || (pEVar8 = sqlite3ExprSkipCollate((Expr *)pTab->zName), pEVar8->op != 0x98)) ||
       (pEVar8->iTable != base)) goto LAB_0019b1b0;
    if ((pIdx->zName == (char *)0x0) || ((int)(uint)pIdx->nColumn <= sortOrder)) {
      isEq = -1;
      isMatch = 0;
      pConstraint = (WhereTerm *)0x0;
    }
    else {
      isEq = pIdx->aiColumn[sortOrder];
      if (isEq == pIdx->pTable->iPKey) {
        isEq = -1;
      }
      isMatch = (int)pIdx->aSortOrder[sortOrder];
      pConstraint = (WhereTerm *)pIdx->azColl[sortOrder];
    }
    if (pEVar8->iColumn == isEq) {
      if (pConstraint == (WhereTerm *)0x0) {
        bVar13 = true;
      }
      else {
        _iColumn = sqlite3ExprCollSeq(pParse_00,(Expr *)pTab->zName);
        if (_iColumn == (CollSeq *)0x0) {
          _iColumn = psVar3->pDfltColl;
        }
        iVar6 = sqlite3_stricmp(_iColumn->zName,(char *)pConstraint);
        bVar13 = iVar6 == 0;
      }
    }
    else {
      bVar13 = false;
    }
    uVar7 = isMatch ^ (uint)*(byte *)&pTab->pSelect;
    pWVar9 = findTerm(p->pWC,base,isEq,p->notReady,0x83,pIdx);
    if (pWVar9 == (WhereTerm *)0x0) {
      local_a8 = 0;
    }
    else if ((pWVar9->eOperator & 1) == 0) {
      if ((pWVar9->eOperator & 0x80) == 0) {
        if (pWVar9->prereqRight == 0) {
          local_a8 = 1;
        }
        else {
          pEVar8 = pWVar9->pExpr->pRight;
          if (pEVar8->op == 0x98) {
            local_a8 = isOrderedColumn(p,pEVar8->iTable,(int)pEVar8->iColumn);
            if (((bVar13) && (1 < local_a8)) && (local_a8 != *(byte *)&pTab->pSelect + 2))
            goto LAB_0019b1b0;
          }
          else {
            local_a8 = 0;
          }
        }
      }
      else {
        wsFlags = 0;
        local_a8 = 1;
      }
    }
    else {
      local_a8 = 0;
    }
    if (bVar13) {
      uVar5 = pOBItem._4_4_;
      if (((local_a8 != 1) && (uVar5 = uVar7, pOBItem._4_4_ != 2)) &&
         (uVar5 = pOBItem._4_4_, uVar7 != pOBItem._4_4_)) goto LAB_0019b1b0;
      pOBItem._4_4_ = uVar5;
      nTerm = nTerm + 1;
      pTab = (Table *)&pTab->pFKey;
      if (isEq < 0) {
        bVar14 = true;
LAB_0019b1b0:
        if (bVar14) {
          wsFlags = 1;
        }
        else if ((wsFlags == 0) || (sortOrder < (int)(uint)pIdx->nColumn)) {
          wsFlags = 0;
        }
        if (pTab == (Table *)(pEVar4->a + uniqueNotNull)) {
          return uniqueNotNull;
        }
        if ((!bVar12) && (wsFlags == 0)) {
          return uniqueNotNull;
        }
        *pbObUnique = wsFlags;
        *pbRev = pOBItem._4_4_ & 1;
        if (wsFlags != 0) {
          pMaskSet = p->pWC->pMaskSet;
          BVar10 = getMask(pMaskSet,base);
          while( true ) {
            bVar14 = false;
            if (nTerm < iVar1) {
              BVar11 = exprTableUsage(pMaskSet,pEVar4->a[nTerm].pExpr);
              bVar14 = (BVar11 & (BVar10 ^ 0xffffffffffffffff)) == 0;
            }
            if (!bVar14) break;
            nTerm = nTerm + 1;
          }
        }
        return nTerm;
      }
      if ((pTVar2->aCol[isEq].notNull == '\0') && (local_a8 != 1)) {
        wsFlags = 0;
      }
    }
    else if (local_a8 == 0) goto LAB_0019b1b0;
    sortOrder = sortOrder + 1;
  } while( true );
}

Assistant:

static int isSortingIndex(
  WhereBestIdx *p,    /* Best index search context */
  Index *pIdx,        /* The index we are testing */
  int base,           /* Cursor number for the table to be sorted */
  int *pbRev,         /* Set to 1 for reverse-order scan of pIdx */
  int *pbObUnique     /* ORDER BY column values will different in every row */
){
  int i;                        /* Number of pIdx terms used */
  int j;                        /* Number of ORDER BY terms satisfied */
  int sortOrder = 2;            /* 0: forward.  1: backward.  2: unknown */
  int nTerm;                    /* Number of ORDER BY terms */
  struct ExprList_item *pOBItem;/* A term of the ORDER BY clause */
  Table *pTab = pIdx->pTable;   /* Table that owns index pIdx */
  ExprList *pOrderBy;           /* The ORDER BY clause */
  Parse *pParse = p->pParse;    /* Parser context */
  sqlite3 *db = pParse->db;     /* Database connection */
  int nPriorSat;                /* ORDER BY terms satisfied by outer loops */
  int seenRowid = 0;            /* True if an ORDER BY rowid term is seen */
  int uniqueNotNull;            /* pIdx is UNIQUE with all terms are NOT NULL */
  int outerObUnique;            /* Outer loops generate different values in
                                ** every row for the ORDER BY columns */

  if( p->i==0 ){
    nPriorSat = 0;
    outerObUnique = 1;
  }else{
    u32 wsFlags = p->aLevel[p->i-1].plan.wsFlags;
    nPriorSat = p->aLevel[p->i-1].plan.nOBSat;
    if( (wsFlags & WHERE_ORDERED)==0 ){
      /* This loop cannot be ordered unless the next outer loop is
      ** also ordered */
      return nPriorSat;
    }
    if( OptimizationDisabled(db, SQLITE_OrderByIdxJoin) ){
      /* Only look at the outer-most loop if the OrderByIdxJoin
      ** optimization is disabled */
      return nPriorSat;
    }
    testcase( wsFlags & WHERE_OB_UNIQUE );
    testcase( wsFlags & WHERE_ALL_UNIQUE );
    outerObUnique = (wsFlags & (WHERE_OB_UNIQUE|WHERE_ALL_UNIQUE))!=0;
  }
  pOrderBy = p->pOrderBy;
  assert( pOrderBy!=0 );
  if( pIdx->bUnordered ){
    /* Hash indices (indicated by the "unordered" tag on sqlite_stat1) cannot
    ** be used for sorting */
    return nPriorSat;
  }
  nTerm = pOrderBy->nExpr;
  uniqueNotNull = pIdx->onError!=OE_None;
  assert( nTerm>0 );

  /* Argument pIdx must either point to a 'real' named index structure, 
  ** or an index structure allocated on the stack by bestBtreeIndex() to
  ** represent the rowid index that is part of every table.  */
  assert( pIdx->zName || (pIdx->nColumn==1 && pIdx->aiColumn[0]==-1) );

  /* Match terms of the ORDER BY clause against columns of
  ** the index.
  **
  ** Note that indices have pIdx->nColumn regular columns plus
  ** one additional column containing the rowid.  The rowid column
  ** of the index is also allowed to match against the ORDER BY
  ** clause.
  */
  j = nPriorSat;
  for(i=0,pOBItem=&pOrderBy->a[j]; j<nTerm && i<=pIdx->nColumn; i++){
    Expr *pOBExpr;          /* The expression of the ORDER BY pOBItem */
    CollSeq *pColl;         /* The collating sequence of pOBExpr */
    int termSortOrder;      /* Sort order for this term */
    int iColumn;            /* The i-th column of the index.  -1 for rowid */
    int iSortOrder;         /* 1 for DESC, 0 for ASC on the i-th index term */
    int isEq;               /* Subject to an == or IS NULL constraint */
    int isMatch;            /* ORDER BY term matches the index term */
    const char *zColl;      /* Name of collating sequence for i-th index term */
    WhereTerm *pConstraint; /* A constraint in the WHERE clause */

    /* If the next term of the ORDER BY clause refers to anything other than
    ** a column in the "base" table, then this index will not be of any
    ** further use in handling the ORDER BY. */
    pOBExpr = sqlite3ExprSkipCollate(pOBItem->pExpr);
    if( pOBExpr->op!=TK_COLUMN || pOBExpr->iTable!=base ){
      break;
    }

    /* Find column number and collating sequence for the next entry
    ** in the index */
    if( pIdx->zName && i<pIdx->nColumn ){
      iColumn = pIdx->aiColumn[i];
      if( iColumn==pIdx->pTable->iPKey ){
        iColumn = -1;
      }
      iSortOrder = pIdx->aSortOrder[i];
      zColl = pIdx->azColl[i];
      assert( zColl!=0 );
    }else{
      iColumn = -1;
      iSortOrder = 0;
      zColl = 0;
    }

    /* Check to see if the column number and collating sequence of the
    ** index match the column number and collating sequence of the ORDER BY
    ** clause entry.  Set isMatch to 1 if they both match. */
    if( pOBExpr->iColumn==iColumn ){
      if( zColl ){
        pColl = sqlite3ExprCollSeq(pParse, pOBItem->pExpr);
        if( !pColl ) pColl = db->pDfltColl;
        isMatch = sqlite3StrICmp(pColl->zName, zColl)==0;
      }else{
        isMatch = 1;
      }
    }else{
      isMatch = 0;
    }

    /* termSortOrder is 0 or 1 for whether or not the access loop should
    ** run forward or backwards (respectively) in order to satisfy this 
    ** term of the ORDER BY clause. */
    assert( pOBItem->sortOrder==0 || pOBItem->sortOrder==1 );
    assert( iSortOrder==0 || iSortOrder==1 );
    termSortOrder = iSortOrder ^ pOBItem->sortOrder;

    /* If X is the column in the index and ORDER BY clause, check to see
    ** if there are any X= or X IS NULL constraints in the WHERE clause. */
    pConstraint = findTerm(p->pWC, base, iColumn, p->notReady,
                           WO_EQ|WO_ISNULL|WO_IN, pIdx);
    if( pConstraint==0 ){
      isEq = 0;
    }else if( (pConstraint->eOperator & WO_IN)!=0 ){
      isEq = 0;
    }else if( (pConstraint->eOperator & WO_ISNULL)!=0 ){
      uniqueNotNull = 0;
      isEq = 1;  /* "X IS NULL" means X has only a single value */
    }else if( pConstraint->prereqRight==0 ){
      isEq = 1;  /* Constraint "X=constant" means X has only a single value */
    }else{
      Expr *pRight = pConstraint->pExpr->pRight;
      if( pRight->op==TK_COLUMN ){
        WHERETRACE(("       .. isOrderedColumn(tab=%d,col=%d)",
                    pRight->iTable, pRight->iColumn));
        isEq = isOrderedColumn(p, pRight->iTable, pRight->iColumn);
        WHERETRACE((" -> isEq=%d\n", isEq));

        /* If the constraint is of the form X=Y where Y is an ordered value
        ** in an outer loop, then make sure the sort order of Y matches the
        ** sort order required for X. */
        if( isMatch && isEq>=2 && isEq!=pOBItem->sortOrder+2 ){
          testcase( isEq==2 );
          testcase( isEq==3 );
          break;
        }
      }else{
        isEq = 0;  /* "X=expr" places no ordering constraints on X */
      }
    }
    if( !isMatch ){
      if( isEq==0 ){
        break;
      }else{
        continue;
      }
    }else if( isEq!=1 ){
      if( sortOrder==2 ){
        sortOrder = termSortOrder;
      }else if( termSortOrder!=sortOrder ){
        break;
      }
    }
    j++;
    pOBItem++;
    if( iColumn<0 ){
      seenRowid = 1;
      break;
    }else if( pTab->aCol[iColumn].notNull==0 && isEq!=1 ){
      testcase( isEq==0 );
      testcase( isEq==2 );
      testcase( isEq==3 );
      uniqueNotNull = 0;
    }
  }
  if( seenRowid ){
    uniqueNotNull = 1;
  }else if( uniqueNotNull==0 || i<pIdx->nColumn ){
    uniqueNotNull = 0;
  }

  /* If we have not found at least one ORDER BY term that matches the
  ** index, then show no progress. */
  if( pOBItem==&pOrderBy->a[nPriorSat] ) return nPriorSat;

  /* Either the outer queries must generate rows where there are no two
  ** rows with the same values in all ORDER BY columns, or else this
  ** loop must generate just a single row of output.  Example:  Suppose
  ** the outer loops generate A=1 and A=1, and this loop generates B=3
  ** and B=4.  Then without the following test, ORDER BY A,B would 
  ** generate the wrong order output: 1,3 1,4 1,3 1,4
  */
  if( outerObUnique==0 && uniqueNotNull==0 ) return nPriorSat;
  *pbObUnique = uniqueNotNull;

  /* Return the necessary scan order back to the caller */
  *pbRev = sortOrder & 1;

  /* If there was an "ORDER BY rowid" term that matched, or it is only
  ** possible for a single row from this table to match, then skip over
  ** any additional ORDER BY terms dealing with this table.
  */
  if( uniqueNotNull ){
    /* Advance j over additional ORDER BY terms associated with base */
    WhereMaskSet *pMS = p->pWC->pMaskSet;
    Bitmask m = ~getMask(pMS, base);
    while( j<nTerm && (exprTableUsage(pMS, pOrderBy->a[j].pExpr)&m)==0 ){
      j++;
    }
  }
  return j;
}